

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O3

tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
binary::uvarint_abi_cxx11_
          (tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,binary *this,Bytes *buf)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  allocator_type local_41;
  uint local_40;
  uint local_3c;
  void *local_38;
  undefined8 uStack_30;
  long local_28;
  
  binUvarint((binary *)&local_40,(Bytes *)this);
  if ((ulong)local_40 == 0) {
    *(undefined1 **)
     &(__return_storage_ptr__->
      super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super__Tuple_impl<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_head_impl.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         = (undefined1 *)
           ((long)&(__return_storage_ptr__->
                   super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Tuple_impl<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                   ._M_head_impl.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           + 0x10);
    lVar2 = DAT_0014c768;
    lVar3 = multihash::errVarIntBufferTooShort_abi_cxx11_;
  }
  else {
    if (-1 < (int)local_40) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_38,
                 (uchar *)((ulong)local_40 + *(long *)this),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )*(uchar **)(this + 8),&local_41);
      pvVar1 = *(void **)this;
      lVar2 = *(long *)(this + 0x10);
      *(void **)this = local_38;
      *(undefined8 *)(this + 8) = uStack_30;
      *(long *)(this + 0x10) = local_28;
      local_38 = (void *)0x0;
      uStack_30 = 0;
      local_28 = 0;
      if ((pvVar1 != (void *)0x0) &&
         (operator_delete(pvVar1,lVar2 - (long)pvVar1), local_38 != (void *)0x0)) {
        operator_delete(local_38,local_28 - (long)local_38);
      }
      *(bool *)((long)&(__return_storage_ptr__->
                       super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).
                       super__Tuple_impl<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                       ._M_head_impl.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               + 0x20) = false;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).super__Head_base<0UL,_unsigned_int,_false>._M_head_impl = local_3c;
      return __return_storage_ptr__;
    }
    *(undefined1 **)
     &(__return_storage_ptr__->
      super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super__Tuple_impl<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_head_impl.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         = (undefined1 *)
           ((long)&(__return_storage_ptr__->
                   super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Tuple_impl<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                   ._M_head_impl.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           + 0x10);
    lVar2 = DAT_0014c788;
    lVar3 = multihash::errVarIntTooLong_abi_cxx11_;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,lVar3,lVar2 + lVar3);
  *(bool *)((long)&(__return_storage_ptr__->
                   super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Tuple_impl<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                   ._M_head_impl.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           + 0x20) = true;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).super__Head_base<0UL,_unsigned_int,_false>._M_head_impl = 0;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<UInt, OptError> uvarint(Bytes &buf) {
	auto [n, c] = binUvarint(buf);
	if (c == 0) {
		return {0, errVarIntBufferTooShort};
	}
	if (c < 0) {
		return {0, errVarIntTooLong};
	}
	buf = Bytes{buf.begin() + c, buf.end()};
	return {n, std::nullopt};
}